

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_basetableref.cpp
# Opt level: O1

unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>,_true> __thiscall
duckdb::Binder::BindAtClause(Binder *this,optional_ptr<duckdb::AtClause,_true> at_clause)

{
  ClientContext *pCVar1;
  type expr_00;
  AtClause *in_RDX;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> expr;
  Value val;
  ConstantBinder binder;
  undefined1 local_120 [8];
  optional_ptr<duckdb::AtClause,_true> local_118;
  string local_110;
  Value local_f0;
  ConstantBinder local_b0;
  
  if (in_RDX == (AtClause *)0x0) {
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    pCVar1 = (ClientContext *)((at_clause.ptr)->unit).field_2._M_allocated_capacity;
    local_118.ptr = in_RDX;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"AT clause","");
    ConstantBinder::ConstantBinder(&local_b0,(Binder *)at_clause.ptr,pCVar1,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    optional_ptr<duckdb::AtClause,_true>::CheckValid(&local_118);
    ExpressionBinder::Bind
              ((ExpressionBinder *)local_120,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_b0,(optional_ptr<duckdb::LogicalType,_true>)&(local_118.ptr)->expr,false);
    pCVar1 = (ClientContext *)((at_clause.ptr)->unit).field_2._M_allocated_capacity;
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)local_120);
    ExpressionExecutor::EvaluateScalar(&local_f0,pCVar1,expr_00,false);
    optional_ptr<duckdb::AtClause,_true>::CheckValid(&local_118);
    make_uniq<duckdb::BoundAtClause,std::__cxx11::string_const&,duckdb::Value>
              ((duckdb *)this,&(local_118.ptr)->unit,&local_f0);
    Value::~Value(&local_f0);
    if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_120
        != (Expression *)0x0) {
      (**(code **)(*(_func_int **)local_120 + 8))();
    }
    local_b0.super_ExpressionBinder._vptr_ExpressionBinder =
         (_func_int **)&PTR__ConstantBinder_0248e6f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.clause._M_dataplus._M_p != &local_b0.clause.field_2) {
      operator_delete(local_b0.clause._M_dataplus._M_p);
    }
    ExpressionBinder::~ExpressionBinder(&local_b0.super_ExpressionBinder);
  }
  return (unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>)
         (unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>)this;
}

Assistant:

unique_ptr<BoundAtClause> Binder::BindAtClause(optional_ptr<AtClause> at_clause) {
	if (!at_clause) {
		return nullptr;
	}
	ConstantBinder binder(*this, context, "AT clause");
	auto expr = binder.Bind(at_clause->ExpressionMutable());
	auto val = ExpressionExecutor::EvaluateScalar(context, *expr);
	return make_uniq<BoundAtClause>(at_clause->Unit(), std::move(val));
}